

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::SkipAnyJsonValue(Parser *this)

{
  int iVar1;
  CheckedError *ce;
  long lVar2;
  int t;
  Parser *in_RSI;
  bool bVar3;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  ParseDepthGuard depth_guard;
  
  ParseDepthGuard::ParseDepthGuard(&depth_guard,in_RSI);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    iVar1 = (in_RSI->super_ParserState).token_;
    if (iVar1 - 0x101U < 3) {
      Next(this);
    }
    else {
      t = (int)in_RSI;
      if (iVar1 == 0x5b) {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          lVar2 = 0;
          do {
            bVar3 = lVar2 == 0;
            lVar2 = lVar2 + -1;
            if ((bVar3 || (~(in_RSI->opts).strict_json & 1U) != 0) &&
               ((in_RSI->super_ParserState).token_ == 0x5d)) {
LAB_0010a33c:
              Next(this);
              goto LAB_0010a35e;
            }
            SkipAnyJsonValue(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            CheckedError::~CheckedError((CheckedError *)this);
            if ((in_RSI->super_ParserState).token_ == 0x5d) goto LAB_0010a33c;
            ParseComma(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            CheckedError::~CheckedError((CheckedError *)this);
          } while( true );
        }
        goto LAB_0010a373;
      }
      if (iVar1 == 0x7b) {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          lVar2 = 0;
          do {
            if (((byte)(lVar2 == 0 | (in_RSI->opts).strict_json ^ 1U) == 1) &&
               ((in_RSI->super_ParserState).token_ == 0x7d)) {
LAB_0010a353:
              Next(this);
              goto LAB_0010a35e;
            }
            local_58 = 0;
            local_50[0] = 0;
            local_60 = local_50;
            std::__cxx11::string::_M_assign((string *)&local_60);
            if ((in_RSI->super_ParserState).token_ == 0x101) {
              Next(this);
            }
            else {
              Expect(this,t);
            }
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010a330;
            CheckedError::~CheckedError((CheckedError *)this);
            if (((in_RSI->opts).protobuf_ascii_alike != true) ||
               (((in_RSI->super_ParserState).token_ | 0x20U) != 0x7b)) {
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010a330;
              CheckedError::~CheckedError((CheckedError *)this);
            }
            SkipAnyJsonValue(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            bVar3 = *(char *)&(this->super_ParserState).prev_cursor_ == '\0';
            if (bVar3) {
              CheckedError::~CheckedError((CheckedError *)this);
              lVar2 = lVar2 + 1;
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
            }
            else if (!bVar3) goto LAB_0010a330;
            CheckedError::~CheckedError((CheckedError *)this);
            if ((in_RSI->super_ParserState).token_ == 0x7d) {
              std::__cxx11::string::~string((string *)&local_60);
              goto LAB_0010a353;
            }
            ParseComma(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010a330;
            CheckedError::~CheckedError((CheckedError *)this);
            std::__cxx11::string::~string((string *)&local_60);
          } while( true );
        }
        goto LAB_0010a373;
      }
      bVar3 = IsIdent(in_RSI,"true");
      if ((((!bVar3) && (bVar3 = IsIdent(in_RSI,"false"), !bVar3)) &&
          (bVar3 = IsIdent(in_RSI,"null"), !bVar3)) && (bVar3 = IsIdent(in_RSI,"inf"), !bVar3)) {
        TokenError(this);
        goto LAB_0010a373;
      }
      Next(this);
    }
LAB_0010a35e:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
  goto LAB_0010a373;
LAB_0010a330:
  std::__cxx11::string::~string((string *)&local_60);
LAB_0010a373:
  (depth_guard.parser_)->parse_depth_counter_ = (depth_guard.parser_)->parse_depth_counter_ + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::SkipAnyJsonValue() {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  switch (token_) {
    case '{': {
      size_t fieldn_outer = 0;
      return ParseTableDelimiters(fieldn_outer, nullptr,
                                  [&](const std::string &, size_t &fieldn,
                                      const StructDef *) -> CheckedError {
                                    ECHECK(SkipAnyJsonValue());
                                    fieldn++;
                                    return NoError();
                                  });
    }
    case '[': {
      size_t count = 0;
      return ParseVectorDelimiters(
          count, [&](size_t &) -> CheckedError { return SkipAnyJsonValue(); });
    }
    case kTokenStringConstant:
    case kTokenIntegerConstant:
    case kTokenFloatConstant: NEXT(); break;
    default:
      if (IsIdent("true") || IsIdent("false") || IsIdent("null") ||
          IsIdent("inf")) {
        NEXT();
      } else
        return TokenError();
  }
  return NoError();
}